

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMU_PUBLIC_ID_Unmarshal(TPMU_PUBLIC_ID *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_PUBLIC_ID *target_local;
  
  switch(selector) {
  case 1:
    target_local._4_4_ = TPM2B_PUBLIC_KEY_RSA_Unmarshal(&target->rsa,buffer,size);
    break;
  default:
    target_local._4_4_ = 0x98;
    break;
  case 8:
    target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->keyedHash,buffer,size);
    break;
  case 0x23:
    target_local._4_4_ = TPMS_ECC_POINT_Unmarshal(&target->ecc,buffer,size);
    break;
  case 0x25:
    target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->keyedHash,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMU_PUBLIC_ID_Unmarshal(TPMU_PUBLIC_ID *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->keyedHash), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->sym), buffer, size);
#endif // ALG_SYMCIPHER
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPM2B_PUBLIC_KEY_RSA_Unmarshal((TPM2B_PUBLIC_KEY_RSA *)&(target->rsa), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPMS_ECC_POINT_Unmarshal((TPMS_ECC_POINT *)&(target->ecc), buffer, size);
#endif // ALG_ECC
    }
    return TPM_RC_SELECTOR;
}